

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_23::TapAssertionPrinter::printResultType
          (TapAssertionPrinter *this,StringRef passOrFail)

{
  bool bVar1;
  ostream *poVar2;
  TapAssertionPrinter *this_local;
  StringRef passOrFail_local;
  
  passOrFail_local.m_start = (char *)passOrFail.m_size;
  this_local = (TapAssertionPrinter *)passOrFail.m_start;
  bVar1 = StringRef::empty((StringRef *)&this_local);
  if (!bVar1) {
    poVar2 = Catch::operator<<(this->stream,(StringRef *)&this_local);
    poVar2 = std::operator<<(poVar2,' ');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->counter);
    std::operator<<(poVar2," -");
  }
  return;
}

Assistant:

void printResultType(StringRef passOrFail) const {
                if (!passOrFail.empty()) {
                    stream << passOrFail << ' ' << counter << " -";
                }
            }